

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

char * __thiscall kj::Path::basename(Path *this,char *__filename)

{
  undefined8 *puVar1;
  long lVar2;
  String *pSVar3;
  long lVar4;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Array<kj::String> result;
  
  _kjCondition.left = *(unsigned_long *)(__filename + 8);
  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = _kjCondition.left != 0;
  if (_kjCondition.result) {
    pSVar3 = _::HeapArrayDisposer::allocateUninitialized<kj::String>(1);
    _kjCondition.op.content.size_ = (size_t)&_::HeapArrayDisposer::instance;
    lVar2 = *(long *)__filename;
    lVar4 = *(long *)(__filename + 8) * 0x18;
    (pSVar3->content).ptr = *(char **)(lVar2 + -0x18 + lVar4);
    (pSVar3->content).size_ = *(size_t *)(lVar2 + -0x10 + lVar4);
    (pSVar3->content).disposer = *(ArrayDisposer **)(lVar2 + -8 + lVar4);
    puVar1 = (undefined8 *)(lVar2 + -0x18 + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    result.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    _kjCondition.left = 0;
    _kjCondition.right = 0;
    _kjCondition._12_4_ = 0;
    _kjCondition.op.content.ptr = (char *)0x0;
    (this->parts).ptr = pSVar3;
    (this->parts).size_ = 1;
    (this->parts).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    result.ptr = (String *)0x0;
    result.size_ = 0;
    Array<kj::String>::~Array(&result);
    ArrayBuilder<kj::String>::dispose((ArrayBuilder<kj::String> *)&_kjCondition);
    return (char *)this;
  }
  _::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[26]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x78,FAILED,"parts.size() > 0","_kjCondition,\"root path has no basename\"",
             &_kjCondition,(char (*) [26])"root path has no basename");
  _::Debug::Fault::fatal(&f);
}

Assistant:

bool PathPtr::operator==(PathPtr other) const {
  return parts == other.parts;
}